

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O1

void __thiscall cubeb_init_destroy_context_Test::TestBody(cubeb_init_destroy_context_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelperData *this_00;
  stringstream *psVar3;
  int line;
  anon_enum_32 *in_RCX;
  AssertionResult gtest_ar;
  cubeb *ctx;
  int r;
  AssertHelper local_60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58 [2];
  AssertionResult local_48;
  cubeb *local_38;
  int local_2c;
  AssertHelper local_28;
  
  local_2c = common_init(&local_38,"test_sanity");
  local_58[0].ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_58[0].ptr_._4_4_ << 0x20);
  testing::internal::EqHelper<false>::Compare<int,__0>
            (&local_48.success_,(char *)&local_2c,(int *)local_58,in_RCX);
  if (local_48.success_ == false) {
    psVar3 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar3);
    *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_48.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
    }
    line = 0x54;
    local_58[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_58[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((internal *)&local_48,"ctx","nullptr",&local_38,&local_58[0].ptr_);
    if (local_48.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_48.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pcVar2 = cubeb_get_backend_id(local_38);
      local_48.success_ = pcVar2 != (char *)0x0;
      local_48.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_48.success_) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_48.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        fprintf(_stderr,"Backend: %s\n",pcVar2);
        cubeb_destroy(local_38);
        return;
      }
      this_00 = (AssertHelperData *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream((stringstream *)this_00);
      *(undefined8 *)((long)&(this_00->message).c_str_ + *(long *)(*(long *)&this_00->line + -0x18))
           = 0x11;
      local_60.data_ = this_00;
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)local_58,&local_48,"backend_id","false","true");
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                 ,0x58,(char *)local_58[0].ptr_);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (local_58[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete__(local_58[0].ptr_);
      }
      if (local_60.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_60.data_ + 8))();
        }
        local_60.data_ = (AssertHelperData *)0x0;
      }
      goto LAB_0010797f;
    }
    psVar3 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar3);
    *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_48.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
    }
    line = 0x55;
    local_58[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
             ,line,pcVar2);
  testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if (local_58[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_58[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_58[0].ptr_ + 8))();
    }
    local_58[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
LAB_0010797f:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(cubeb, init_destroy_context)
{
  int r;
  cubeb * ctx;
  char const* backend_id;

  r = common_init(&ctx, "test_sanity");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  backend_id = cubeb_get_backend_id(ctx);
  ASSERT_TRUE(backend_id);

  fprintf(stderr, "Backend: %s\n", backend_id);

  cubeb_destroy(ctx);
}